

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall MultiObjTestSolver<0>::~MultiObjTestSolver(MultiObjTestSolver<0> *this)

{
  BasicSolver *this_00;
  void *pvVar1;
  
  this_00 = (BasicSolver *)
            ((long)&this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.
                    super_BasicSolver.warnings_._M_t._M_impl.super__Rb_tree_header + 0x18);
  *(undefined ***)
   ((long)&this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
           warnings_._M_t._M_impl.super__Rb_tree_header + 0x18) = &PTR__Solver_0028adb8;
  *(undefined ***)
   ((long)&this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
           warnings_._M_t._M_impl.super__Rb_tree_header + 0x20) = &PTR__Solver_0028ae28;
  this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
  constr_descr_header_.field_2._M_allocated_capacity = (size_type)&PTR__Solver_0028ae50;
  *(undefined ***)
   ((long)&this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
           constr_descr_header_.field_2 + 8) = &PTR__Solver_0028ae80;
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR__Solver_0028aea0;
  pvVar1 = *(void **)&(this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.
                      super_BasicSolver.warnings_._M_t._M_impl;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)*(_Base_ptr *)
                                  ((long)&(this->super_SolverImpl<MultiObjMockProblemBuilder>).
                                          super_Solver.super_BasicSolver.warnings_._M_t._M_impl.
                                          super__Rb_tree_header + 8) - (long)pvVar1);
  }
  mp::BasicSolver::~BasicSolver(this_00);
  operator_delete(this_00,0x308);
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}